

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_smother(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int npulse;
  int iVar1;
  int iVar2;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  CHAR_DATA *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff98;
  CHAR_DATA *in_stack_ffffffffffffffa0;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
      (void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
  act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
      (void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
  act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
      (void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
  npulse = number_percent();
  iVar1 = get_curr_stat(in_stack_ffffffffffffffa0,iVar1);
  iVar2 = (iVar1 + -0xc) * 6;
  if (npulse != iVar2 && SBORROW4(npulse,iVar2) == npulse + (iVar1 + -0xc) * -6 < 0) {
    init_affect((AFFECT_DATA *)0x6e2a36);
    std::pow<int,int>(0,0x6e2a7e);
    affect_to_char(in_stack_ffffffffffffff70,
                   (AFFECT_DATA *)CONCAT44(npulse,in_stack_ffffffffffffff68));
  }
  LAG_CHAR(in_stack_ffffffffffffff70,npulse);
  return;
}

Assistant:

void spell_smother(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	act("$N chokes and gasps for air as you smother $M with thick smoke!", ch, 0, victim, TO_CHAR);
	act("You choke and gasp for air as $n smothers you with thick smoke!", ch, 0, victim, TO_VICT);
	act("$N chokes and gasps for air as $n smothers $M with thick smoke!", ch, 0, victim, TO_NOTVICT);

	if (number_percent() > 6 * (get_curr_stat(victim, STAT_CON) - 12))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_MALADY;
		af.type = sn;
		af.location = 0;
		af.duration = 1;
		af.level = level;
		af.modifier = 0;

		SET_BIT(af.bitvector, AFF_BLIND);

		af.mod_name = MOD_VISION;
		af.owner = ch;
		affect_to_char(victim, &af);
	}

	LAG_CHAR(victim, PULSE_VIOLENCE);
}